

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

int __thiscall capnp::DynamicList::Builder::init(Builder *this,EVP_PKEY_CTX *ctx)

{
  ElementSize elementSize;
  undefined2 uVar1;
  Which elementType_00;
  uint uVar2;
  ushort uVar3;
  ByteCount in_ECX;
  uint in_EDX;
  ulong uVar4;
  Builder BVar5;
  Type TVar6;
  Fault f;
  ListSchema elementType;
  Reader local_f8;
  Type local_c8;
  PointerBuilder local_b8;
  Schema local_a0;
  anon_union_8_2_eba6ea51_for_Type_5 local_98;
  SegmentBuilder *pSStack_90;
  CapTableBuilder *local_88;
  ListBuilder local_80;
  ListBuilder local_58;
  
  if (*(uint *)(ctx + 0x28) <= in_EDX) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4e0,FAILED,"index < this->size()","\"List index out-of-bounds.\"",
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal((Fault *)&local_f8);
  }
  uVar4 = (ulong)in_EDX;
  uVar1 = 0xe;
  if (ctx[2] == (EVP_PKEY_CTX)0x0) {
    uVar1 = *(undefined2 *)ctx;
  }
  switch(uVar1) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xf:
  case 0x10:
  case 0x11:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
              ((Fault *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x4f2,FAILED,(char *)0x0,"\"Expected a list or blob.\"",
               (char (*) [25])"Expected a list or blob.");
    kj::_::Debug::Fault::fatal((Fault *)&local_f8);
  case 0xc:
    local_f8._reader.data = (void *)((*(uint *)(ctx + 0x2c) * uVar4 >> 3) + *(long *)(ctx + 0x20));
    local_f8._reader.segment = *(SegmentReader **)(ctx + 0x10);
    local_f8._reader.capTable = *(CapTableReader **)(ctx + 0x18);
    capnp::_::PointerBuilder::initBlob<capnp::Text>
              ((Builder *)&local_98,(PointerBuilder *)&local_f8,in_ECX);
    (this->builder).capTable = local_88;
    (this->schema).elementType.field_4 = local_98;
    (this->builder).segment = pSStack_90;
    (this->schema).elementType.baseType = UINT8;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    break;
  case 0xd:
    local_f8._reader.data = (void *)((*(uint *)(ctx + 0x2c) * uVar4 >> 3) + *(long *)(ctx + 0x20));
    local_f8._reader.segment = *(SegmentReader **)(ctx + 0x10);
    local_f8._reader.capTable = *(CapTableReader **)(ctx + 0x18);
    BVar5 = capnp::_::PointerBuilder::initBlob<capnp::Data>((PointerBuilder *)&local_f8,in_ECX);
    (this->schema).elementType.baseType = UINT16;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    *(ArrayPtr<unsigned_char> *)&(this->schema).elementType.field_4 =
         BVar5.super_ArrayPtr<unsigned_char>;
    break;
  case 0xe:
    TVar6 = (Type)Type::asList((Type *)ctx);
    local_c8 = TVar6;
    if (TVar6.baseType == STRUCT &&
        ((undefined1  [16])TVar6 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      local_b8.pointer =
           (WirePointer *)((*(uint *)(ctx + 0x2c) * uVar4 >> 3) + *(long *)(ctx + 0x20));
      local_b8.segment = *(SegmentBuilder **)(ctx + 0x10);
      local_b8.capTable = *(CapTableBuilder **)(ctx + 0x18);
      local_a0.raw = (RawBrandedSchema *)Type::asStruct(&local_c8);
      Schema::getProto(&local_f8,&local_a0);
      uVar2 = 0;
      if (local_f8._reader.dataSize < 0x80) {
        uVar3 = 0;
      }
      else {
        uVar3 = (((WirePointer *)((long)local_f8._reader.data + 8))->field_1).structRef.ptrCount.
                value;
        if (0xcf < local_f8._reader.dataSize) {
          uVar2 = (uint)(ushort)(((WirePointer *)((long)local_f8._reader.data + 0x18))->
                                offsetAndKind).value << 0x10;
        }
      }
      capnp::_::PointerBuilder::initStructList
                (&local_58,&local_b8,in_ECX,(StructSize)(uVar3 | uVar2));
      *(undefined8 *)&this[1].schema.elementType = local_58._32_8_;
    }
    else {
      local_f8._reader.data = (void *)((*(uint *)(ctx + 0x2c) * uVar4 >> 3) + *(long *)(ctx + 0x20))
      ;
      local_f8._reader.segment = *(SegmentReader **)(ctx + 0x10);
      local_f8._reader.capTable = *(CapTableReader **)(ctx + 0x18);
      elementType_00 = LIST;
      if (((undefined1  [16])TVar6 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        elementType_00 = TVar6.baseType;
      }
      elementSize = anon_unknown_71::elementSizeFor(elementType_00);
      capnp::_::PointerBuilder::initList(&local_80,(PointerBuilder *)&local_f8,elementSize,in_ECX);
      *(undefined8 *)&this[1].schema.elementType = local_80._32_8_;
      local_58.segment._0_4_ = local_80.segment._0_4_;
      local_58.segment._4_4_ = local_80.segment._4_4_;
      local_58.capTable._0_4_ = local_80.capTable._0_4_;
      local_58.capTable._4_4_ = local_80.capTable._4_4_;
      local_58.ptr._0_4_ = (ListElementCount)local_80.ptr;
      local_58.ptr._4_4_ = local_80.ptr._4_4_;
      local_58.elementCount = local_80.elementCount;
      local_58.step = local_80.step;
    }
    (this->builder).elementCount = (ListElementCount)local_58.ptr;
    (this->builder).step = local_58.ptr._4_4_;
    (this->builder).structDataSize = local_58.elementCount;
    (this->builder).structPointerCount = (short)local_58.step;
    (this->builder).elementSize = (char)(local_58.step >> 0x10);
    (this->builder).field_0x27 = (char)(local_58.step >> 0x18);
    *(undefined4 *)&(this->builder).capTable = local_58.segment._0_4_;
    *(undefined4 *)((long)&(this->builder).capTable + 4) = local_58.segment._4_4_;
    *(undefined4 *)&(this->builder).ptr = local_58.capTable._0_4_;
    *(undefined4 *)((long)&(this->builder).ptr + 4) = local_58.capTable._4_4_;
    (this->schema).elementType.baseType = UINT32;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
    *(Type *)&(this->schema).elementType.field_4 = TVar6;
    break;
  case 0x12:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x50e,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal((Fault *)&local_f8);
  default:
    (this->schema).elementType.baseType = VOID;
    (this->schema).elementType.listDepth = '\0';
    (this->schema).elementType.isImplicitParam = false;
  }
  return (int)this;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::init(uint index, uint size) {
  KJ_REQUIRE(index < this->size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("Expected a list or blob.");
      return nullptr;

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Text>(bounded(size) * BYTES);

    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .initBlob<Data>(bounded(size) * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();

      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initStructList(bounded(size) * ELEMENTS,
                                   structSizeFromSchema(elementType.getStructElementType())));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .initList(elementSizeFor(elementType.whichElementType()),
                             bounded(size) * ELEMENTS));
      }
    }

    case schema::Type::ANY_POINTER: {
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;
    }
  }

  return nullptr;
}